

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlXPathAddValues(void)

{
  int iVar1;
  int iVar2;
  uint local_1c;
  int n_ctxt;
  xmlXPathParserContextPtr ctxt;
  int mem_base;
  int test_ret;
  
  ctxt._4_4_ = 0;
  for (local_1c = 0; (int)local_1c < 1; local_1c = local_1c + 1) {
    iVar1 = xmlMemBlocks();
    xmlXPathAddValues(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar2 = xmlMemBlocks();
    if (iVar1 != iVar2) {
      iVar2 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathAddValues",(ulong)(uint)(iVar2 - iVar1));
      ctxt._4_4_ = ctxt._4_4_ + 1;
      printf(" %d",(ulong)local_1c);
      printf("\n");
    }
  }
  function_tests = function_tests + 1;
  return ctxt._4_4_;
}

Assistant:

static int
test_xmlXPathAddValues(void) {
    int test_ret = 0;

#if defined(LIBXML_XPATH_ENABLED)
    int mem_base;
    xmlXPathParserContextPtr ctxt; /* the XPath Parser context */
    int n_ctxt;

    for (n_ctxt = 0;n_ctxt < gen_nb_xmlXPathParserContextPtr;n_ctxt++) {
        mem_base = xmlMemBlocks();
        ctxt = gen_xmlXPathParserContextPtr(n_ctxt, 0);

        xmlXPathAddValues(ctxt);
        call_tests++;
        des_xmlXPathParserContextPtr(n_ctxt, ctxt, 0);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlXPathAddValues",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_ctxt);
            printf("\n");
        }
    }
    function_tests++;
#endif

    return(test_ret);
}